

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O0

uint8_t try_clock(int clock,btbb_packet *pkt)

{
  uint8_t uVar1;
  uint16_t data;
  int iVar2;
  char local_58 [3];
  char acStack_55 [2];
  uint8_t hec;
  uint16_t hdr_data;
  char unwhitened [18];
  char local_38 [8];
  char header [18];
  char *stream;
  btbb_packet *pkt_local;
  int clock_local;
  
  register0x00000000 = pkt->symbols + 0x44;
  iVar2 = unfec13(register0x00000000,local_38,0x12);
  if (iVar2 == 0) {
    pkt_local._7_1_ = '\0';
  }
  else {
    unwhiten(local_38,local_58,clock,0x12,0,pkt);
    data = air_to_host16(local_58,10);
    uVar1 = air_to_host8(unwhitened + 2,8);
    uVar1 = uap_from_hec(data,uVar1);
    pkt->UAP = uVar1;
    uVar1 = air_to_host8(acStack_55,4);
    pkt->packet_type = uVar1;
    pkt_local._7_1_ = pkt->UAP;
  }
  return pkt_local._7_1_;
}

Assistant:

uint8_t try_clock(int clock, btbb_packet* pkt)
{
	/* skip 72 bit access code */
	char *stream = pkt->symbols + 68;
	/* 18 bit packet header */
	char header[18];
	char unwhitened[18];

	if (!unfec13(stream, header, 18))
		return 0;
	unwhiten(header, unwhitened, clock, 18, 0, pkt);
	uint16_t hdr_data = air_to_host16(unwhitened, 10);
	uint8_t hec = air_to_host8(&unwhitened[10], 8);
	pkt->UAP = uap_from_hec(hdr_data, hec);
	pkt->packet_type = air_to_host8(&unwhitened[3], 4);

	return pkt->UAP;
}